

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O1

int CMAC_ACPKM_Mesh(CMAC_ACPKM_CTX *ctx)

{
  EVP_CIPHER_CTX *pEVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  EVP_CIPHER *pEVar5;
  uchar *iv;
  
  uVar4 = 1;
  if (ctx->section_size <= ctx->num) {
    ctx->num = 0;
    pEVar1 = (EVP_CIPHER_CTX *)ctx->actx;
    pEVar5 = EVP_CIPHER_CTX_cipher(pEVar1);
    iVar2 = EVP_CIPHER_get_key_length(pEVar5);
    iVar3 = EVP_CIPHER_CTX_get_block_size(ctx->cctx);
    iVar2 = EVP_Cipher(pEVar1,ctx->km,zero_iv,iVar2 + iVar3);
    if (iVar2 == 0) {
      uVar4 = 0;
    }
    else {
      pEVar1 = (EVP_CIPHER_CTX *)ctx->cctx;
      iv = (uchar *)EVP_CIPHER_CTX_iv(pEVar1);
      iVar2 = EVP_EncryptInit_ex(pEVar1,(EVP_CIPHER *)0x0,(ENGINE *)0x0,ctx->km,iv);
      uVar4 = (uint)(iVar2 != 0);
    }
  }
  return uVar4;
}

Assistant:

static int CMAC_ACPKM_Mesh(CMAC_ACPKM_CTX *ctx)
{
    if (ctx->num < ctx->section_size)
        return 1;
    ctx->num = 0;
    if (!CMAC_ACPKM_Master(ctx))
        return 0;
    /* Restart cbc with new key */
    if (!EVP_EncryptInit_ex(ctx->cctx, NULL, NULL, ctx->km,
            EVP_CIPHER_CTX_iv(ctx->cctx)))
        return 0;
    return 1;
}